

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_device_main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_b0 [4];
  int code;
  sigset_t sigs_to_catch;
  int sig;
  ithread_t cmdloop_thread;
  char **ppcStack_18;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  cmdloop_thread._4_4_ = device_main(argc,argv);
  iVar1 = cmdloop_thread._4_4_;
  if (cmdloop_thread._4_4_ == 0) {
    iVar1 = pthread_create((pthread_t *)&stack0xffffffffffffffd8,(pthread_attr_t *)0x0,
                           TvDeviceCommandLoop,(void *)0x0);
    if (iVar1 == 0) {
      sigemptyset((sigset_t *)local_b0);
      sigaddset((sigset_t *)local_b0,2);
      sigwait((sigset_t *)local_b0,(int *)((long)sigs_to_catch.__val + 0x7c));
      SampleUtil_Print("Shutting down on signal %d...\n",(ulong)sigs_to_catch.__val[0xf]._4_4_);
      iVar1 = TvDeviceStop();
    }
    else {
      argv_local._4_4_ = -0x38f;
      iVar1 = argv_local._4_4_;
    }
  }
  argv_local._4_4_ = iVar1;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	int rc;
	ithread_t cmdloop_thread;
#ifdef _WIN32
#else
	int sig;
	sigset_t sigs_to_catch;
#endif
	int code;

	rc = device_main(argc, argv);
	if (rc != UPNP_E_SUCCESS) {
		return rc;
	}

	/* start a command loop thread */
	code = ithread_create(&cmdloop_thread, NULL, TvDeviceCommandLoop, NULL);
	if (code != 0) {
		return UPNP_E_INTERNAL_ERROR;
	}
#ifdef _WIN32
	ithread_join(cmdloop_thread, NULL);
#else
	/* Catch Ctrl-C and properly shutdown */
	sigemptyset(&sigs_to_catch);
	/* Comment the line below if you are running gdb, otherwise you will be
	 * unable to interrupt with CTRL-C. */
	sigaddset(&sigs_to_catch, SIGINT);
	sigwait(&sigs_to_catch, &sig);
	SampleUtil_Print("Shutting down on signal %d...\n", sig);
#endif
	rc = TvDeviceStop();

	return rc;
}